

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyself.c
# Opt level: O1

void change_sex(void)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  short sVar5;
  char *__src;
  permonst *ptr;
  
  iVar3 = u.umonnum;
  iVar2 = u.umonster;
  if ((u.umonnum == u.umonster) || (((youmonst.data)->mflags2 & 0x70000) == 0)) {
    flags.female = flags.female == '\0';
  }
  if (u.umonnum == u.umonster) {
    max_rank_sz();
    bVar1 = flags.female;
  }
  else {
    u._1052_1_ = u._1052_1_ ^ 8;
    max_rank_sz();
    bVar1 = u._1052_1_ & 8;
  }
  if ((bVar1 == 0) || (__src = urole.name.f, urole.name.f == (char *)0x0)) {
    __src = urole.name.m;
  }
  strcpy(pl_character,__src);
  bVar1 = flags.female;
  if (iVar3 != iVar2) {
    bVar1 = u._1052_1_ & 8;
  }
  if ((bVar1 == 0) || (sVar5 = urole.femalenum, urole.femalenum == -1)) {
    sVar5 = urole.malenum;
  }
  u.umonster = (int)sVar5;
  iVar4 = u.umonster;
  if ((iVar3 != iVar2) && (iVar4 = u.umonnum, u.umonnum - 0x12fU < 2)) {
    flags.female = flags.female == '\0';
    u.umonnum = (u.umonnum == 0x12f) + 0x12f;
    if (u.umonnum == u.umonster) {
      ptr = &upermonst;
    }
    else {
      ptr = (permonst *)
            ((long)&((permonst *)(mons[0].mattk + -4))->mname + (ulong)(uint)(u.umonnum * 0x40));
    }
    set_mon_data(&youmonst,ptr,0);
    return;
  }
  u.umonnum = iVar4;
  return;
}

Assistant:

void change_sex(void)
{
	/* setting u.umonster for caveman/cavewoman or priest/priestess
	   swap unintentionally makes `Upolyd' appear to be true */
	boolean already_polyd = (boolean) Upolyd;

	/* Some monsters are always of one sex and their sex can't be changed */
	/* succubi/incubi can change, but are handled below */
	/* !already_polyd check necessary because is_male() and is_female()
           are true if the player is a priest/priestess */
	if (!already_polyd || (!is_male(youmonst.data) && !is_female(youmonst.data) && !is_neuter(youmonst.data)))
	    flags.female = !flags.female;
	if (already_polyd)	/* poly'd: also change saved sex */
	    u.mfemale = !u.mfemale;
	max_rank_sz();		/* [this appears to be superfluous] */
	if ((already_polyd ? u.mfemale : flags.female) && urole.name.f)
	    strcpy(pl_character, urole.name.f);
	else
	    strcpy(pl_character, urole.name.m);
	u.umonster = ((already_polyd ? u.mfemale : flags.female) && urole.femalenum != NON_PM) ?
			urole.femalenum : urole.malenum;
	if (!already_polyd) {
	    u.umonnum = u.umonster;
	} else if (u.umonnum == PM_SUCCUBUS || u.umonnum == PM_INCUBUS) {
	    flags.female = !flags.female;
	    /* change monster type to match new sex */
	    u.umonnum = (u.umonnum == PM_SUCCUBUS) ? PM_INCUBUS : PM_SUCCUBUS;
	    set_uasmon();
	}
}